

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O3

int Fraig_NodeIsInSupergate(Fraig_Node_t *pOld,Fraig_Node_t *pNew)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (((ulong)pNew ^ (ulong)pOld) < 2) {
    uVar3 = (uint)(pOld == pNew) * 2 - 1;
  }
  else {
    uVar3 = 0;
    if (((ulong)pOld & 1) == 0) {
      iVar1 = Fraig_NodeIsVar(pOld);
      if (iVar1 == 0) {
        iVar1 = Fraig_NodeIsInSupergate(pOld->p1,pNew);
        iVar2 = Fraig_NodeIsInSupergate(pOld->p2,pNew);
        uVar3 = 0xffffffff;
        if (iVar2 != -1 && iVar1 != -1) {
          uVar3 = (uint)(iVar2 == 1 || iVar1 == 1);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

int Fraig_NodeIsInSupergate( Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    int RetValue1, RetValue2;
    if ( Fraig_Regular(pOld) == Fraig_Regular(pNew) )
        return (pOld == pNew)? 1 : -1;
    if ( Fraig_IsComplement(pOld) || Fraig_NodeIsVar(pOld) )
        return 0;
    RetValue1 = Fraig_NodeIsInSupergate( pOld->p1, pNew );
    RetValue2 = Fraig_NodeIsInSupergate( pOld->p2, pNew );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    if ( RetValue1 ==  1 || RetValue2 ==  1 )
        return 1;
    return 0;
}